

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall iDynTree::InverseKinematics::setVerbosity(InverseKinematics *this,uint verbose)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

void InverseKinematics::setVerbosity(const unsigned int verbose)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        IK_PIMPL(m_pimpl)->m_verbosityLevel = verbose;
#else
        missingIpoptErrorReport();
#endif
    }